

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O2

void test_ack_decode(void)

{
  int iVar1;
  uint8_t *p;
  uint8_t **end;
  ulong uVar2;
  uint64_t uVar3;
  uint8_t pat [4];
  uint8_t auStack_1464 [4];
  uint8_t **local_1460;
  uint8_t *src;
  uint8_t *local_1450 [127];
  quicly_ack_frame_t decoded;
  
  src = pat;
  _pat = (uint8_t **)CONCAT44(auStack_1464,0x11000034);
  iVar1 = quicly_decode_ack_frame(&src,auStack_1464,&decoded,0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x45)
  ;
  _ok((uint)(src == auStack_1464),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x46)
  ;
  _ok((uint)(decoded.largest_acknowledged == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x47)
  ;
  _ok((uint)(decoded.num_gaps == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x48)
  ;
  _ok((uint)(decoded.ack_block_lengths[0] == 0x12),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x49)
  ;
  _ok((uint)(decoded.smallest_acknowledged == 0x23),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c");
  src = (uint8_t *)0x403020100020034;
  end = local_1450;
  _pat = &src;
  iVar1 = quicly_decode_ack_frame((uint8_t **)pat,(uint8_t *)end,&decoded,0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x50)
  ;
  _ok((uint)(_pat == end),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x51)
  ;
  _ok((uint)(decoded.largest_acknowledged == 0x34),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x52)
  ;
  _ok((uint)(decoded.num_gaps == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x53)
  ;
  _ok((uint)(decoded.ack_block_lengths[0] == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x54)
  ;
  _ok((uint)(decoded.gaps[0] == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x55)
  ;
  _ok((uint)(decoded.ack_block_lengths[1] == 3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x56)
  ;
  _ok((uint)(decoded.gaps[1] == 4),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x57)
  ;
  _ok((uint)(decoded.ack_block_lengths[2] == 5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x58)
  ;
  _ok((uint)(decoded.smallest_acknowledged == 0x26),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c");
  _pat = &src;
  src = (uint8_t *)0x81e410000fa0080;
  for (uVar3 = 0; uVar3 != 0x11e; uVar3 = uVar3 + 1) {
    p = ptls_encode_quicint((uint8_t *)end,uVar3);
    end = (uint8_t **)ptls_encode_quicint(p,uVar3 % 10);
  }
  local_1460 = end;
  iVar1 = quicly_decode_ack_frame((uint8_t **)pat,(uint8_t *)end,&decoded,0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6a)
  ;
  _ok((uint)(decoded.largest_acknowledged == 64000),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6b)
  ;
  _ok((uint)(decoded.ack_delay == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6c)
  ;
  _ok((uint)(decoded.num_gaps == 0x100),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6d)
  ;
  _ok((uint)(decoded.ack_block_lengths[0] == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x6e)
  ;
  uVar3 = decoded.ack_block_lengths[0];
  uVar2 = 0;
  while (uVar2 < decoded.num_gaps) {
    _ok((uint)(uVar2 + 1 == decoded.gaps[uVar2]),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
        0x71);
    _ok((uint)((uVar2 / 10) * -10 + 1 + uVar2 == decoded.ack_block_lengths[uVar2 + 1]),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",
        0x72);
    uVar3 = uVar3 + decoded.gaps[uVar2] + decoded.ack_block_lengths[uVar2 + 1];
    uVar2 = uVar2 + 1;
  }
  _ok((uint)(_pat == local_1460),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x75)
  ;
  _ok((uint)(decoded.smallest_acknowledged == 0xfa01 - uVar3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/frame.c",0x76)
  ;
  subtest("underflow",test_ack_decode_underflow);
  return;
}

Assistant:

static void test_ack_decode(void)
{
    {
        const uint8_t pat[] = {0x34, 0x00, 0x00, 0x11}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 0);
        ok(decoded.ack_block_lengths[0] == 0x12);
        ok(decoded.smallest_acknowledged == 0x34 - 0x12 + 1);
    }

    {
        const uint8_t pat[] = {0x34, 0x00, 0x02, 0x00, 0x01, 0x02, 0x03, 0x04}, *src = pat;
        quicly_ack_frame_t decoded;
        ok(quicly_decode_ack_frame(&src, pat + sizeof(pat), &decoded, 0) == 0);
        ok(src == pat + sizeof(pat));
        ok(decoded.largest_acknowledged == 0x34);
        ok(decoded.num_gaps == 2);
        ok(decoded.ack_block_lengths[0] == 1);
        ok(decoded.gaps[0] == 2);
        ok(decoded.ack_block_lengths[1] == 3);
        ok(decoded.gaps[1] == 4);
        ok(decoded.ack_block_lengths[2] == 5);
        ok(decoded.smallest_acknowledged == 0x34 - 1 - 2 - 3 - 4 - 5 + 1);
    }

    { /* Bogus ACK Frame larger than the internal buffer */
        uint8_t pat[1024], *end = pat;
        const uint8_t *src = pat;
        uint64_t i, range_sum;
        quicly_ack_frame_t decoded;
        end = quicly_encodev(end, 0xFA00);
        end = quicly_encodev(end, 0);
        end = quicly_encodev(end, QUICLY_ACK_MAX_GAPS + 30); // with excess ranges
        end = quicly_encodev(end, 8);
        for (i = 0; i < QUICLY_ACK_MAX_GAPS + 30; ++i) {
            end = quicly_encodev(end, i);      // gap
            end = quicly_encodev(end, i % 10); // ack-range
        }

        ok(quicly_decode_ack_frame(&src, end, &decoded, 0) == 0);
        ok(decoded.largest_acknowledged == 0xFA00);
        ok(decoded.ack_delay == 0);
        ok(decoded.num_gaps == QUICLY_ACK_MAX_GAPS);
        ok(decoded.ack_block_lengths[0] == 8 + 1); // first ack-range
        range_sum = decoded.ack_block_lengths[0];
        for (i = 0; i < decoded.num_gaps; ++i) {
            ok(decoded.gaps[i] == i + 1);
            ok(decoded.ack_block_lengths[i + 1] == (i % 10) + 1);
            range_sum += decoded.gaps[i] + decoded.ack_block_lengths[i + 1];
        }
        ok(src == end); // decoded the entire frame
        ok(decoded.smallest_acknowledged == 0xFA00 - range_sum + 1);
    }

    subtest("underflow", test_ack_decode_underflow);
}